

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

void VP8SetSegmentParams(VP8Encoder *enc,float quality)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  VP8SegmentInfo *pVVar17;
  VP8Matrix *m;
  double dVar18;
  double dVar19;
  int map [4];
  byte local_48 [4];
  undefined4 uStack_44;
  undefined8 uStack_40;
  double local_38;
  
  uVar3 = (enc->segment_hdr).num_segments;
  iVar14 = enc->config->sns_strength;
  dVar18 = (double)quality / 100.0;
  if (enc->config->emulate_jpeg_size == 0) {
    dVar18 = (double)(~-(ulong)(dVar18 < 0.75) & (ulong)(dVar18 + dVar18 + -1.0) |
                     (ulong)(dVar18 * 0.6666666666666666) & -(ulong)(dVar18 < 0.75));
    dVar19 = 0.3333333333333333;
  }
  else {
    dVar19 = (double)enc->alpha / 255.0;
    if (dVar19 <= 0.85) {
      dVar19 = (double)(~-(ulong)(dVar19 < 0.3) &
                        (ulong)((dVar19 + -0.3) * -0.9090909090909091 + 0.9) |
                       -(ulong)(dVar19 < 0.3) & 0x3feccccccccccccd);
    }
    else {
      dVar19 = 0.4;
    }
  }
  dVar18 = pow(dVar18,dVar19);
  if ((int)uVar3 < 1) {
    iVar14 = enc->dqm[0].quant;
    enc->base_quant = iVar14;
  }
  else {
    lVar15 = 0;
    local_38 = dVar18;
    do {
      dVar18 = pow(local_38,(double)*(int *)((long)&enc->dqm[0].alpha + lVar15) *
                            (((double)iVar14 * 0.9) / 100.0) * -0.0078125 + 1.0);
      iVar2 = (int)((1.0 - dVar18) * 127.0);
      if (0x7e < iVar2) {
        iVar2 = 0x7f;
      }
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      *(int *)((long)&enc->dqm[0].quant + lVar15) = iVar2;
      lVar15 = lVar15 + 0x2e8;
    } while ((ulong)uVar3 * 0x2e8 - lVar15 != 0);
    iVar14 = enc->dqm[0].quant;
    enc->base_quant = iVar14;
    if (3 < (int)uVar3) goto LAB_00139c9c;
  }
  lVar15 = (long)(int)uVar3;
  piVar8 = &enc->dqm[lVar15].quant;
  do {
    lVar15 = lVar15 + 1;
    *piVar8 = iVar14;
    piVar8 = piVar8 + 0xba;
  } while ((int)lVar15 != 4);
LAB_00139c9c:
  iVar2 = (int)((ulong)((long)(enc->uv_alpha * 10 + -0x280) * -0x15f15f15) >> 0x20) +
          enc->uv_alpha * 10 + -0x280;
  iVar14 = enc->config->sns_strength;
  iVar2 = (iVar14 * ((iVar2 >> 6) - (iVar2 >> 0x1f))) / 100;
  iVar6 = 6;
  if (iVar2 < 6) {
    iVar6 = iVar2;
  }
  iVar2 = -4;
  if (-4 < iVar6) {
    iVar2 = iVar6;
  }
  iVar14 = (int)((ulong)((long)iVar14 * -0x51eb851f) >> 0x20);
  iVar6 = (iVar14 >> 3) - (iVar14 >> 0x1f);
  iVar14 = 0xf;
  if (iVar6 < 0xf) {
    iVar14 = iVar6;
  }
  iVar6 = -0xf;
  if (-0xf < iVar14) {
    iVar6 = iVar14;
  }
  enc->dq_y1_dc = 0;
  enc->dq_y2_dc = 0;
  enc->dq_y2_ac = 0;
  enc->dq_uv_dc = iVar6;
  enc->dq_uv_ac = iVar2;
  iVar14 = enc->config->filter_strength;
  lVar15 = 0x2ac;
  do {
    uVar5 = *(uint *)((long)enc->dqm[0].y1.q + lVar15 + -4);
    if (0x7e < (int)uVar5) {
      uVar5 = 0x7f;
    }
    uVar10 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar10 = 0;
    }
    iVar2 = VP8FilterStrengthFromDelta((enc->filter_hdr).sharpness,(uint)(kAcTable[uVar10] >> 2));
    iVar6 = (iVar2 * iVar14 * 5) / (*(int *)((long)enc->dqm[0].y1.q + lVar15 + -8) + 0x100);
    iVar2 = 0x3f;
    if (iVar6 < 0x3f) {
      iVar2 = iVar6;
    }
    if (iVar6 < 2) {
      iVar2 = 0;
    }
    *(int *)((long)enc->dqm[0].y1.q + lVar15) = iVar2;
    lVar15 = lVar15 + 0x2e8;
  } while (lVar15 != 0xe4c);
  (enc->filter_hdr).level = enc->dqm[0].fstrength;
  (enc->filter_hdr).simple = (uint)(enc->config->filter_type == 0);
  (enc->filter_hdr).sharpness = enc->config->filter_sharpness;
  if (1 < (int)uVar3) {
    _local_48 = 0x100000000;
    uStack_40 = 0x300000002;
    uVar3 = (enc->segment_hdr).num_segments;
    uVar5 = 4;
    if ((int)uVar3 < 4) {
      uVar5 = uVar3;
    }
    iVar14 = 1;
    if (1 < (int)uVar3) {
      uVar16 = 1;
      uVar10 = 1;
      do {
        iVar14 = (int)uVar16;
        pVVar17 = enc->dqm + uVar10;
        if (iVar14 < 1) {
          iVar2 = 0;
        }
        else {
          uVar9 = 0;
          piVar8 = &enc->dqm[0].fstrength;
          do {
            if ((pVVar17->quant == piVar8[-1]) && (pVVar17->fstrength == *piVar8)) {
              *(int *)(local_48 + uVar10 * 4) = (int)uVar9;
              goto LAB_00139eb0;
            }
            uVar9 = uVar9 + 1;
            piVar8 = piVar8 + 0xba;
            iVar2 = iVar14;
          } while (uVar16 != uVar9);
        }
        *(int *)(local_48 + uVar10 * 4) = iVar2;
        if (uVar16 != uVar10) {
          memcpy(enc->dqm + iVar14,pVVar17,0x2e8);
        }
        uVar16 = (ulong)(iVar14 + 1);
LAB_00139eb0:
        iVar14 = (int)uVar16;
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar5);
    }
    if (iVar14 < (int)uVar5) {
      uVar3 = enc->mb_h * enc->mb_w;
      if (0 < (int)uVar3) {
        uVar10 = (ulong)uVar3 + 1;
        do {
          bVar1 = *(byte *)(enc->mb_info + (uVar10 - 2));
          *(byte *)(enc->mb_info + (uVar10 - 2)) =
               bVar1 & 0x9f | (local_48[bVar1 >> 3 & 0xc] & 3) << 5;
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
      (enc->segment_hdr).num_segments = iVar14;
      lVar15 = (long)(int)uVar5 - (long)iVar14;
      pVVar17 = enc->dqm + iVar14;
      do {
        memcpy(pVVar17,enc->dqm + (iVar14 + -1),0x2e8);
        pVVar17 = pVVar17 + 1;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
  }
  iVar14 = 0;
  if (3 < enc->method) {
    iVar14 = enc->config->sns_strength;
  }
  lVar15 = (long)(enc->segment_hdr).num_segments;
  if (0 < lVar15) {
    m = &enc->dqm[0].uv;
    do {
      uVar3 = *(uint *)(m[1].q + 4);
      uVar5 = enc->dq_y1_dc + uVar3;
      if (0x7e < (int)uVar5) {
        uVar5 = 0x7f;
      }
      uVar10 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar10 = 0;
      }
      uVar5 = 0x7f;
      if ((int)uVar3 < 0x7f) {
        uVar5 = uVar3;
      }
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      m[-2].q[0] = (ushort)kDcTable[uVar10];
      m[-2].q[1] = kAcTable[uVar5];
      uVar5 = enc->dq_y2_dc + uVar3;
      if (0x7e < (int)uVar5) {
        uVar5 = 0x7f;
      }
      uVar13 = 0;
      uVar10 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar10 = 0;
      }
      m[-1].q[0] = (ushort)kDcTable[uVar10] * 2;
      uVar5 = enc->dq_y2_ac + uVar3;
      if (0x7e < (int)uVar5) {
        uVar5 = 0x7f;
      }
      if ((int)uVar5 < 1) {
        uVar5 = uVar13;
      }
      m[-1].q[1] = kAcTable2[uVar5];
      uVar5 = enc->dq_uv_dc + uVar3;
      if (0x74 < (int)uVar5) {
        uVar5 = 0x75;
      }
      if ((int)uVar5 < 1) {
        uVar5 = uVar13;
      }
      m->q[0] = (ushort)kDcTable[uVar5];
      uVar3 = uVar3 + enc->dq_uv_ac;
      if (0x7e < (int)uVar3) {
        uVar3 = 0x7f;
      }
      if ((int)uVar3 < 1) {
        uVar3 = uVar13;
      }
      m->q[1] = kAcTable[uVar3];
      iVar6 = ExpandMatrix(m + -2,0);
      iVar2 = ExpandMatrix(m + -1,1);
      iVar4 = ExpandMatrix(m,2);
      uVar3 = iVar6 * iVar6;
      iVar12 = (int)(uVar3 * 3) >> 7;
      *(int *)(m[1].q + 0xe) = iVar12;
      uVar5 = iVar2 * iVar2;
      *(uint *)(m[1].q + 0xc) = uVar5 * 3;
      iVar11 = iVar4 * iVar4 * 3 >> 6;
      *(int *)m[1].iq = iVar11;
      *(uint *)(m[1].iq + 2) = uVar3 >> 7;
      iVar7 = (int)(uVar3 * 7) >> 3;
      *(int *)(m[1].iq + 10) = iVar7;
      *(uint *)(m[1].iq + 8) = uVar5 >> 2;
      iVar2 = iVar4 * iVar4 * 2;
      *(int *)(m[1].iq + 0xc) = iVar2;
      iVar6 = iVar6 * iVar14 >> 5;
      *(int *)(m[1].iq + 6) = iVar6;
      if (iVar12 < 1) {
        m[1].q[0xe] = 1;
        m[1].q[0xf] = 0;
      }
      if ((int)(uVar5 * 3) < 1) {
        m[1].q[0xc] = 1;
        m[1].q[0xd] = 0;
      }
      if (iVar11 < 1) {
        m[1].iq[0] = 1;
        m[1].iq[1] = 0;
      }
      if (uVar3 < 0x80) {
        m[1].iq[2] = 1;
        m[1].iq[3] = 0;
      }
      if (iVar7 < 1) {
        m[1].iq[10] = 1;
        m[1].iq[0xb] = 0;
      }
      if (uVar5 < 4) {
        m[1].iq[8] = 1;
        m[1].iq[9] = 0;
      }
      if (iVar2 < 1) {
        m[1].iq[0xc] = 1;
        m[1].iq[0xd] = 0;
      }
      if (iVar6 < 1) {
        m[1].iq[6] = 1;
        m[1].iq[7] = 0;
      }
      *(uint *)(m[1].q + 10) = (uint)m[-2].q[0] * 0x14;
      m[1].q[8] = 0;
      m[1].q[9] = 0;
      *(long *)m[1].bias = (long)(int)(uVar3 * 1000);
      m = (VP8Matrix *)(m[3].bias + 2);
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  return;
}

Assistant:

void VP8SetSegmentParams(VP8Encoder* const enc, float quality) {
  int i;
  int dq_uv_ac, dq_uv_dc;
  const int num_segments = enc->segment_hdr.num_segments;
  const double amp = SNS_TO_DQ * enc->config->sns_strength / 100. / 128.;
  const double Q = quality / 100.;
  const double c_base = enc->config->emulate_jpeg_size ?
      QualityToJPEGCompression(Q, enc->alpha / 255.) :
      QualityToCompression(Q);
  for (i = 0; i < num_segments; ++i) {
    // We modulate the base coefficient to accommodate for the quantization
    // susceptibility and allow denser segments to be quantized more.
    const double expn = 1. - amp * enc->dqm[i].alpha;
    const double c = pow(c_base, expn);
    const int q = (int)(127. * (1. - c));
    assert(expn > 0.);
    enc->dqm[i].quant = clip(q, 0, 127);
  }

  // purely indicative in the bitstream (except for the 1-segment case)
  enc->base_quant = enc->dqm[0].quant;

  // fill-in values for the unused segments (required by the syntax)
  for (i = num_segments; i < NUM_MB_SEGMENTS; ++i) {
    enc->dqm[i].quant = enc->base_quant;
  }

  // uv_alpha is normally spread around ~60. The useful range is
  // typically ~30 (quite bad) to ~100 (ok to decimate UV more).
  // We map it to the safe maximal range of MAX/MIN_DQ_UV for dq_uv.
  dq_uv_ac = (enc->uv_alpha - MID_ALPHA) * (MAX_DQ_UV - MIN_DQ_UV)
                                         / (MAX_ALPHA - MIN_ALPHA);
  // we rescale by the user-defined strength of adaptation
  dq_uv_ac = dq_uv_ac * enc->config->sns_strength / 100;
  // and make it safe.
  dq_uv_ac = clip(dq_uv_ac, MIN_DQ_UV, MAX_DQ_UV);
  // We also boost the dc-uv-quant a little, based on sns-strength, since
  // U/V channels are quite more reactive to high quants (flat DC-blocks
  // tend to appear, and are unpleasant).
  dq_uv_dc = -4 * enc->config->sns_strength / 100;
  dq_uv_dc = clip(dq_uv_dc, -15, 15);   // 4bit-signed max allowed

  enc->dq_y1_dc = 0;       // TODO(skal): dq-lum
  enc->dq_y2_dc = 0;
  enc->dq_y2_ac = 0;
  enc->dq_uv_dc = dq_uv_dc;
  enc->dq_uv_ac = dq_uv_ac;

  SetupFilterStrength(enc);   // initialize segments' filtering, eventually

  if (num_segments > 1) SimplifySegments(enc);

  SetupMatrices(enc);         // finalize quantization matrices
}